

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O3

int __thiscall MT32Emu::BReverbModelImpl<short>::close(BReverbModelImpl<short> *this,int __fd)

{
  uint uVar1;
  int in_EAX;
  ulong extraout_RAX;
  BReverbSettings *pBVar2;
  BReverbSettings *extraout_RAX_00;
  AllpassFilter<short> **ppAVar3;
  CombFilter<short> **ppCVar4;
  ulong uVar5;
  ulong uVar6;
  
  ppAVar3 = this->allpasses;
  if (ppAVar3 != (AllpassFilter<short> **)0x0) {
    uVar1 = this->currentSettings->numberOfAllpasses;
    uVar6 = (ulong)uVar1;
    if (uVar1 == 0) {
LAB_0011a049:
      operator_delete__(ppAVar3);
      uVar6 = extraout_RAX;
    }
    else {
      uVar5 = 0;
      do {
        if (this->allpasses[uVar5] != (AllpassFilter<short> *)0x0) {
          (*(this->allpasses[uVar5]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
          this->allpasses[uVar5] = (AllpassFilter<short> *)0x0;
          uVar6 = (ulong)this->currentSettings->numberOfAllpasses;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar6);
      ppAVar3 = this->allpasses;
      if (ppAVar3 != (AllpassFilter<short> **)0x0) goto LAB_0011a049;
    }
    in_EAX = (int)uVar6;
    this->allpasses = (AllpassFilter<short> **)0x0;
  }
  ppCVar4 = this->combs;
  if (ppCVar4 == (CombFilter<short> **)0x0) {
    return in_EAX;
  }
  pBVar2 = this->currentSettings;
  if (pBVar2->numberOfCombs != 0) {
    uVar6 = 0;
    do {
      if (this->combs[uVar6] != (CombFilter<short> *)0x0) {
        (*(this->combs[uVar6]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
        this->combs[uVar6] = (CombFilter<short> *)0x0;
        pBVar2 = this->currentSettings;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < pBVar2->numberOfCombs);
    ppCVar4 = this->combs;
    if (ppCVar4 == (CombFilter<short> **)0x0) goto LAB_0011a0a8;
  }
  operator_delete__(ppCVar4);
  pBVar2 = extraout_RAX_00;
LAB_0011a0a8:
  this->combs = (CombFilter<short> **)0x0;
  return (int)pBVar2;
}

Assistant:

void close() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				if (allpasses[i] != NULL) {
					delete allpasses[i];
					allpasses[i] = NULL;
				}
			}
			delete[] allpasses;
			allpasses = NULL;
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				if (combs[i] != NULL) {
					delete combs[i];
					combs[i] = NULL;
				}
			}
			delete[] combs;
			combs = NULL;
		}
	}